

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,SubscriptWithChevrons *s)

{
  (*this->_vptr_ASTVisitor[3])(this,(s->lhs).object);
  if ((s->rhs).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])(this);
    return;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

virtual void visit (AST::SubscriptWithChevrons& s)
    {
        visitObject (s.lhs);
        visitObject (*s.rhs);
    }